

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

void finaliser_return_opt_string_asciz(strbuf *out,void *ctx)

{
  char *s;
  
  s = *ctx;
  safefree(ctx);
  if (s != (char *)0x0) {
    return_val_string_asciz(out,s);
    return;
  }
  BinarySink_put_fmt(out->binarysink_,"NULL\n");
  return;
}

Assistant:

static void finaliser_return_opt_string_asciz(strbuf *out, void *ctx)
{
    char **valp = (char **)ctx;
    char *val = *valp;
    sfree(valp);
    if (!val)
        put_fmt(out, "NULL\n");
    else
        return_val_string_asciz(out, val);
}